

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O1

void addFacesToMesh(aiMesh *pMesh)

{
  aiFace *paVar1;
  ulong *puVar2;
  aiFace *paVar3;
  uint *puVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  
  uVar6 = (ulong)pMesh->mNumFaces;
  puVar2 = (ulong *)operator_new__(uVar6 * 0x10 + 8);
  paVar1 = (aiFace *)(puVar2 + 1);
  *puVar2 = uVar6;
  if (uVar6 != 0) {
    paVar3 = paVar1;
    do {
      paVar3->mNumIndices = 0;
      paVar3->mIndices = (uint *)0x0;
      paVar3 = paVar3 + 1;
    } while (paVar3 != paVar1 + uVar6);
  }
  pMesh->mFaces = paVar1;
  if (pMesh->mNumFaces != 0) {
    uVar6 = 0;
    iVar7 = 0;
    do {
      paVar1 = pMesh->mFaces;
      paVar1[uVar6].mNumIndices = 3;
      puVar4 = (uint *)operator_new__(0xc);
      paVar1[uVar6].mIndices = puVar4;
      lVar5 = 0;
      do {
        paVar1[uVar6].mIndices[lVar5] = iVar7 + (int)lVar5;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      uVar6 = uVar6 + 1;
      iVar7 = iVar7 + 3;
    } while (uVar6 < pMesh->mNumFaces);
  }
  return;
}

Assistant:

void addFacesToMesh(aiMesh* pMesh)
{
    pMesh->mFaces = new aiFace[pMesh->mNumFaces];
    for (unsigned int i = 0, p = 0; i < pMesh->mNumFaces;++i)    {

        aiFace& face = pMesh->mFaces[i];
        face.mIndices = new unsigned int[face.mNumIndices = 3];
        for (unsigned int o = 0; o < 3;++o,++p) {
            face.mIndices[o] = p;
        }
    }
}